

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlm_global_quantum.cpp
# Opt level: O0

sc_time __thiscall tlm::tlm_global_quantum::compute_local_quantum(tlm_global_quantum *this)

{
  bool bVar1;
  sc_time *t;
  sc_time *in_RSI;
  sc_time *in_RDI;
  sc_time g_quant;
  sc_time current;
  sc_time *in_stack_ffffffffffffffd8;
  sc_time local_20;
  sc_time local_18 [3];
  
  bVar1 = sc_core::sc_time::operator!=(in_RSI,(sc_time *)&sc_core::SC_ZERO_TIME);
  if (bVar1) {
    t = sc_core::sc_time_stamp();
    sc_core::sc_time::sc_time(local_18,t);
    sc_core::sc_time::sc_time(&local_20,in_RSI);
    sc_core::operator%(in_stack_ffffffffffffffd8,in_RSI);
    sc_core::operator-(in_stack_ffffffffffffffd8,in_RSI);
  }
  else {
    sc_core::sc_time::sc_time(in_RDI,(sc_time *)&sc_core::SC_ZERO_TIME);
  }
  return (sc_time)(value_type)in_RDI;
}

Assistant:

sc_core::sc_time
tlm_global_quantum::compute_local_quantum()
{
  if (m_global_quantum != sc_core::SC_ZERO_TIME) {
    const sc_core::sc_time current = sc_core::sc_time_stamp();
    const sc_core::sc_time g_quant = m_global_quantum;
    return g_quant - (current % g_quant);
  } else {
    return sc_core::SC_ZERO_TIME;
  }
}